

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::~DrawCallBatchingTest
          (DrawCallBatchingTest *this)

{
  ~DrawCallBatchingTest(this);
  operator_delete(this,0x1d8);
  return;
}

Assistant:

DrawCallBatchingTest::~DrawCallBatchingTest (void)
{
	deinit();
}